

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O2

void run_word<wchar_t>(string *original,int *none,int *num,int *word,int *kana,int *ideo,locale *l,
                      boundary_type b)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  end;
  _List_iterator<wchar_t> begin;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> test_string;
  vector<int,_std::allocator<int>_> masks;
  vector<int,_std::allocator<int>_> pos;
  list<wchar_t,_std::allocator<wchar_t>_> lst;
  allocator_type local_109;
  string *local_108;
  locale local_100 [8];
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_f8;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_d8;
  long local_d0;
  wchar_t local_c8 [4];
  _Vector_base<int,_std::allocator<int>_> local_b8;
  _Vector_base<int,_std::allocator<int>_> local_98;
  int *local_78;
  int *local_70;
  string *local_68;
  locale local_60 [8];
  locale local_58 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_current = local_c8;
  local_d0 = 0;
  local_c8[0] = L'\0';
  local_108 = original;
  local_78 = num;
  local_70 = ideo;
  local_68 = original;
  for (lVar5 = 0; (&local_68->_M_string_length)[lVar5] != 0; lVar5 = lVar5 + 4) {
    std::locale::locale(local_100,l);
    to_correct_string<wchar_t>(&local_50,local_108,local_100);
    std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
    emplace_back<std::__cxx11::wstring>
              ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_f8,
               &local_50);
    std::__cxx11::wstring::~wstring((wstring *)&local_50);
    std::locale::~locale(local_100);
    std::__cxx11::wstring::append((wstring *)&local_d8);
    local_50._M_dataplus._M_p._0_4_ = (undefined4)local_d0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_98,(int *)&local_50);
    uVar1 = 0;
    uVar2 = 0;
    if (none != (int *)0x0) {
      uVar2 = *(int *)((long)none + lVar5) * 0xf;
    }
    if (local_78 != (int *)0x0) {
      uVar1 = *(int *)((long)local_78 + lVar5) * 0xf0;
    }
    uVar3 = 0;
    uVar4 = 0;
    if (word != (int *)0x0) {
      uVar4 = *(int *)((long)word + lVar5) * 0xf00;
    }
    if (kana != (int *)0x0) {
      uVar3 = *(int *)((long)kana + lVar5) * 0xf000;
    }
    if (local_70 == (int *)0x0) {
      local_50._M_dataplus._M_p._0_4_ = 0;
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *(int *)((long)local_70 + lVar5) * 0xf0000;
    }
    local_50._M_dataplus._M_p._0_4_ =
         uVar1 | uVar2 | uVar4 | uVar3 | (uint)local_50._M_dataplus._M_p;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_b8,(int *)&local_50);
    local_108 = local_108 + 1;
  }
  std::__cxx11::list<wchar_t,std::allocator<wchar_t>>::
  list<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
            ((list<wchar_t,std::allocator<wchar_t>> *)&local_50,local_d8,
             (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )(local_d8._M_current + local_d0),&local_109);
  begin._M_node._4_4_ = local_50._M_dataplus._M_p._4_4_;
  begin._M_node._0_4_ = (uint)local_50._M_dataplus._M_p;
  std::locale::locale(local_58,l);
  test_word_container<wchar_t,std::_List_iterator<wchar_t>>
            (begin,(_List_node_base *)&local_50,(vector<int,_std::allocator<int>_> *)&local_98,
             (vector<int,_std::allocator<int>_> *)&local_b8,&local_f8,local_58,b);
  std::locale::~locale(local_58);
  begin_00._M_current = local_d8._M_current;
  end._M_current = local_d8._M_current + local_d0;
  std::locale::locale(local_60,l);
  test_word_container<wchar_t,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
            (begin_00,end,(vector<int,_std::allocator<int>_> *)&local_98,
             (vector<int,_std::allocator<int>_> *)&local_b8,&local_f8,local_60,b);
  std::locale::~locale(local_60);
  std::__cxx11::_List_base<wchar_t,_std::allocator<wchar_t>_>::_M_clear
            ((_List_base<wchar_t,_std::allocator<wchar_t>_> *)&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void run_word(std::string *original,int *none,int *num,int *word,int *kana,int *ideo,std::locale l,lb::boundary_type b=lb::word)
{
    std::vector<int> pos;
    std::vector<std::basic_string<Char> > chunks;
    std::vector<int> masks;
    std::basic_string<Char> test_string;
    for(int i=0;!original[i].empty();i++) {
        chunks.push_back(to_correct_string<Char>(original[i],l));
        test_string+=chunks.back();
        pos.push_back(test_string.size());
        masks.push_back(
              ( none ? none[i]*15 : 0)
            | ( num  ? ((num[i]*15)  << 4) : 0) 
            | ( word ? ((word[i]*15) << 8) : 0) 
            | ( kana ? ((kana[i]*15) << 12) : 0)
            | ( ideo ? ((ideo[i]*15) << 16) : 0)
        );
    }

    std::list<Char> lst(test_string.begin(),test_string.end());
    test_word_container<Char>(lst.begin(),lst.end(),pos,masks,chunks,l,b);
    test_word_container<Char>(test_string.begin(),test_string.end(),pos,masks,chunks,l,b);
}